

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall Js::JSONStringifier::ReadSpace(JSONStringifier *this,Var space)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this_00;
  JavascriptString *spaceString;
  char *message;
  char *error;
  uint lineNumber;
  charcount_t spaceCount;
  double dVar7;
  
  if (space == (Var)0x0) {
    return;
  }
  if (((ulong)space & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)space & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)space & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)space >> 0x32 == 0) {
        this_00 = UnsafeVarTo<Js::RecyclableObject>(space);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00b65b5a;
          *puVar6 = 0;
        }
        TVar1 = ((this_00->type).ptr)->typeId;
        if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_00b65b5a;
          *puVar6 = 0;
        }
        if ((int)TVar1 < 7) {
          if (2 < TVar1 - TypeIds_Number) {
            if (TVar1 != TypeIds_FirstNumberType) {
              return;
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            error = "(Is(aValue))";
            message = "Ensure var is actually a \'TaggedInt\'";
            lineNumber = 0x43;
            goto LAB_00b6596d;
          }
        }
        else {
          if (TVar1 == TypeIds_String) {
            spaceString = UnsafeVarTo<Js::JavascriptString>(space);
LAB_00b65b47:
            SetStringGap(this,spaceString);
            return;
          }
          if (TVar1 != TypeIds_NumberObject) {
            if (TVar1 != TypeIds_StringObject) {
              return;
            }
            spaceString = JavascriptConversion::ToString(space,this->scriptContext);
            goto LAB_00b65b47;
          }
        }
      }
      dVar7 = JavascriptConversion::ToInteger_Full(space,this->scriptContext);
      if (dVar7 <= 0.0) {
        return;
      }
      if (10.0 <= dVar7) {
        dVar7 = 10.0;
      }
      spaceCount = (charcount_t)(long)dVar7;
      goto LAB_00b6599f;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b65b5a;
    *puVar6 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00b6596d:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,message);
    if (!bVar3) {
LAB_00b65b5a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  cVar4 = 10;
  if ((int)(charcount_t)space < 10) {
    cVar4 = (charcount_t)space;
  }
  spaceCount = 0;
  if (0 < (int)cVar4) {
    spaceCount = cVar4;
  }
LAB_00b6599f:
  SetNumericGap(this,spaceCount);
  return;
}

Assistant:

void
JSONStringifier::ReadSpace(_In_opt_ Var space)
{
    if (space != nullptr)
    {
        switch (JavascriptOperators::GetTypeId(space))
        {
        case TypeIds_Integer:
            this->SetNumericGap(static_cast<charcount_t>(max(0, min(static_cast<int>(MaxGapLength), TaggedInt::ToInt32(space)))));

            break;
        case TypeIds_Number:
        case TypeIds_NumberObject:
        case TypeIds_Int64Number:
        case TypeIds_UInt64Number:
        {
            double numericSpace = JavascriptConversion::ToInteger(space, this->scriptContext);
            if (numericSpace > 0)
            {
                SetNumericGap(numericSpace < static_cast<double>(MaxGapLength) ? static_cast<charcount_t>(numericSpace) : MaxGapLength);
            }
            break;
        }
        case TypeIds_String:
            this->SetStringGap(UnsafeVarTo<JavascriptString>(space));
            break;
        case TypeIds_StringObject:
            this->SetStringGap(JavascriptConversion::ToString(space, this->scriptContext));
            break;
        default:
            break;
        }
    }
}